

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeStringOps.cpp
# Opt level: O0

double gmlc::utilities::getTimeValue(string_view timeString,time_units defUnit)

{
  string_view V;
  string_view trimCharacters;
  string_view input;
  time_units units_00;
  size_type sVar1;
  time_units in_EDX;
  double dVar2;
  basic_string_view<char,_std::char_traits<char>_> bVar3;
  string_view units;
  double val;
  size_t pos;
  undefined1 in_stack_000000b0 [16];
  size_t *in_stack_ffffffffffffff70;
  size_t in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  size_type in_stack_ffffffffffffff88;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffffb0;
  ulong local_28;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  double local_8;
  
  V._M_str = in_stack_ffffffffffffff80;
  V._M_len = in_stack_ffffffffffffff78;
  dVar2 = numConvComp<double>(V,in_stack_ffffffffffffff70);
  sVar1 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::size(&local_18);
  if (local_28 < sVar1) {
    bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                       (size_type)in_stack_ffffffffffffff80);
    input._M_str = in_stack_ffffffffffffffb0;
    input._M_len = (size_t)bVar3._M_str;
    trimCharacters._M_str = (char *)bVar3._M_len;
    trimCharacters._M_len = (size_t)" \t\n\r";
    string_viewOps::trim(input,trimCharacters);
    units_00 = timeUnitsFromString((string_view)in_stack_000000b0);
    local_8 = toSecondMultiplier(units_00);
    local_8 = dVar2 * local_8;
  }
  else {
    local_8 = toSecondMultiplier(in_EDX);
    local_8 = dVar2 * local_8;
  }
  return local_8;
}

Assistant:

double getTimeValue(std::string_view timeString, time_units defUnit)
{
    size_t pos;
    double val = numConvComp<double>(timeString, pos);
    if (pos >= timeString.size()) {
        return val * toSecondMultiplier(defUnit);
    }
    auto units = string_viewOps::trim(timeString.substr(pos));
    return val * toSecondMultiplier(timeUnitsFromString(units));
}